

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t tree_enter_working_dir(tree *t)

{
  long in_RDI;
  wchar_t r;
  wchar_t local_c;
  
  local_c = L'\0';
  if (((0 < *(int *)(in_RDI + 0x68)) && ((*(uint *)(in_RDI + 0x30) & 0x40) == 0)) &&
     (local_c = fchdir(*(int *)(in_RDI + 0x78)), local_c == L'\0')) {
    *(uint *)(in_RDI + 0x30) = *(uint *)(in_RDI + 0x30) & 0xfffffeff;
    *(uint *)(in_RDI + 0x30) = *(uint *)(in_RDI + 0x30) | 0x40;
  }
  return local_c;
}

Assistant:

static int
tree_enter_working_dir(struct tree *t)
{
	int r = 0;

	/*
	 * Change the current directory if really needed.
	 * Sometimes this is unneeded when we did not do
	 * descent.
	 */
	if (t->depth > 0 && (t->flags & onWorkingDir) == 0) {
		r = fchdir(t->working_dir_fd);
		if (r == 0) {
			t->flags &= ~onInitialDir;
			t->flags |= onWorkingDir;
		}
	}
	return (r);
}